

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O2

bool __thiscall
RootIndexProxyModel::moveColumns
          (RootIndexProxyModel *this,QModelIndex *sourceParent,int sourceColumn,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  RootIndexProxyModelPrivate *pRVar1;
  bool bVar2;
  undefined1 uVar3;
  long lVar4;
  long *plVar5;
  QModelIndex local_60;
  QModelIndex local_48;
  
  lVar4 = QAbstractProxyModel::sourceModel();
  if (lVar4 == 0) {
    uVar3 = 0;
  }
  else {
    pRVar1 = this->m_dptr;
    local_48.r = -1;
    local_48.c = -1;
    local_48.i = 0;
    local_48.m = (QAbstractItemModel *)0x0;
    bVar2 = QModelIndex::isValid(sourceParent);
    if (bVar2) {
      (**(code **)(*(long *)this + 400))(&local_48,this,sourceParent);
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pRVar1->m_rootIndex);
    }
    local_60.r = -1;
    local_60.c = -1;
    local_60.i = 0;
    local_60.m = (QAbstractItemModel *)0x0;
    bVar2 = QModelIndex::isValid(destinationParent);
    if (bVar2) {
      (**(code **)(*(long *)this + 400))(&local_60,this,destinationParent);
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&pRVar1->m_rootIndex);
    }
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    uVar3 = (**(code **)(*plVar5 + 0x120))
                      (plVar5,&local_48,sourceColumn,count,&local_60,destinationChild);
  }
  return (bool)uVar3;
}

Assistant:

bool RootIndexProxyModel::moveColumns(const QModelIndex &sourceParent, int sourceColumn, int count, const QModelIndex &destinationParent,
                                      int destinationChild)
{
    Q_ASSERT(!sourceParent.isValid() || sourceParent.model() == this);
    Q_ASSERT(!destinationParent.isValid() || destinationParent.model() == this);
    if (!sourceModel())
        return false;
    Q_D(RootIndexProxyModel);
    QModelIndex srcParent;
    if (sourceParent.isValid())
        srcParent = mapToSource(sourceParent);
    else
        srcParent = d->m_rootIndex;
    QModelIndex destParent;
    if (destinationParent.isValid())
        destParent = mapToSource(destinationParent);
    else
        destParent = d->m_rootIndex;
    return sourceModel()->moveColumns(srcParent, sourceColumn, count, destParent, destinationChild);
}